

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  allocator<char> local_49;
  string local_48 [39];
  byte local_21;
  void *pvStack_20;
  bool enclose_local;
  char *value_local;
  char *key_local;
  xr_ini_writer *this_local;
  
  value_local = (char *)CONCAT44(in_register_00000034,__fd);
  local_21 = (byte)__n & 1;
  pvStack_20 = __buf;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,(char *)__buf,&local_49);
  write(this,__fd,local_48,(ulong)(local_21 & 1));
  std::__cxx11::string::~string(local_48);
  sVar1 = std::allocator<char>::~allocator(&local_49);
  return sVar1;
}

Assistant:

void xr_ini_writer::write(const char *key, const char *value, bool enclose)
{
	write(key, std::string(value), enclose);
}